

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

Error * ot::commissioner::JsonFromFile(Error *__return_storage_ptr__,string *aJson,string *aPath)

{
  bool bVar1;
  Error *aError;
  JsonException *e;
  exception *e_1;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_e0;
  string local_c0;
  input_adapter local_a0;
  undefined1 local_90 [8];
  Json json;
  Error local_70;
  undefined1 local_48 [8];
  string jsonStr;
  string *aPath_local;
  string *aJson_local;
  Error *error;
  
  jsonStr.field_2._M_local_buf[0xf] = '\0';
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_48);
  ReadFile(&local_70,(string *)local_48,aPath);
  aError = Error::operator=(__return_storage_ptr__,&local_70);
  json.m_value.number_integer._0_4_ = 0;
  bVar1 = operator!=(aError,(ErrorCode *)&json.m_value.number_unsigned);
  Error::~Error(&local_70);
  if (!bVar1) {
    StripComments(&local_c0,(string *)local_48);
    nlohmann::detail::input_adapter::
    input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_a0,&local_c0);
    std::
    function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
    ::function(&local_e0,(nullptr_t)0x0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_90,&local_a0,&local_e0,true);
    std::
    function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
    ::~function(&local_e0);
    nlohmann::detail::input_adapter::~input_adapter(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)&e_1,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_90,4,' ',false,strict);
    std::__cxx11::string::operator=((string *)aJson,(string *)&e_1);
    std::__cxx11::string::~string((string *)&e_1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_90);
  }
  jsonStr.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((jsonStr.field_2._M_local_buf[0xf] & 1U) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JsonFromFile(std::string &aJson, const std::string &aPath)
{
    Error       error;
    std::string jsonStr;

    SuccessOrExit(error = ReadFile(jsonStr, aPath));
    try
    {
        Json json = Json::parse(StripComments(jsonStr));
        aJson     = json.dump(JSON_INDENT_DEFAULT);
    } catch (JsonException &e)
    {
        error = {ErrorCode::kBadFormat, e.GetError().GetMessage()};
    } catch (std::exception &e)
    {
        error = {ErrorCode::kBadFormat, e.what()};
    }
exit:
    return error;
}